

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPM2B_NAME_Marshal(TPM2B_NAME *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM2B_NAME *source_local;
  
  source_local._6_2_ = UINT16_Marshal((UINT16 *)source,buffer,size);
  if ((source->t).size != 0) {
    UVar1 = BYTE_Array_Marshal((source->t).name,buffer,size,(uint)(source->t).size);
    source_local._6_2_ = source_local._6_2_ + UVar1;
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPM2B_NAME_Marshal(TPM2B_NAME *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT16_Marshal((UINT16 *)&(source->t.size), buffer, size));
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(source->t.size == 0)
        return result;
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->t.name), buffer, size, (INT32)(source->t.size)));
    return result;
}